

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::sendTo
          (CommonCore *this,InterfaceHandle sourceHandle,void *data,uint64_t length,
          string_view destination)

{
  string_view string2;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view string1;
  anon_class_16_1_bc572e6e_for__M_pred __pred;
  string_view string3;
  bool bVar1;
  GlobalFederateId GVar2;
  undefined8 uVar3;
  char *pcVar4;
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  CommonCore *in_RDI;
  int in_R8D;
  __sv_type _Var5;
  ActionMessage message;
  __normal_iterator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  res;
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  targets;
  FederateState *fed;
  pair<helics::route_id,_helics::ActionMessage> *hndl;
  CommonCore *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  SmallBuffer *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  action_t in_stack_fffffffffffffddc;
  ActionMessage *in_stack_fffffffffffffde0;
  __normal_iterator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  in_stack_fffffffffffffdf0;
  __normal_iterator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  in_stack_fffffffffffffdf8;
  FederateState *in_stack_fffffffffffffe00;
  ActionMessage *local_1e8;
  BrokerBase *pBStack_1e0;
  char local_90 [28];
  action_t local_74;
  FederateState *local_70;
  int local_44;
  pair<helics::route_id,_helics::ActionMessage> *local_40;
  int local_34;
  size_t local_30;
  void *local_28;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  int local_4;
  
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_4 = in_ESI;
  bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  if (bVar1) {
    local_34 = local_4;
    send(in_RDI,local_4,local_28,local_30,in_R8D);
  }
  else {
    local_44 = local_4;
    local_40 = getHandleInfo(in_stack_fffffffffffffdb8,
                             (InterfaceHandle)(BaseType)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
    if (local_40 == (pair<helics::route_id,_helics::ActionMessage> *)0x0) {
      uVar3 = __cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdd0,
                 in_stack_fffffffffffffdc8);
      message_00._M_len._4_4_ = in_stack_fffffffffffffddc;
      message_00._M_len._0_4_ = in_stack_fffffffffffffdd8;
      message_00._M_str = (char *)in_stack_fffffffffffffde0;
      InvalidIdentifier::InvalidIdentifier
                ((InvalidIdentifier *)in_stack_fffffffffffffdd0,message_00);
      __cxa_throw(uVar3,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
    }
    if ((char)(local_40->second).messageID != 'e') {
      uVar3 = __cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdd0,
                 in_stack_fffffffffffffdc8);
      message_01._M_len._4_4_ = in_stack_fffffffffffffddc;
      message_01._M_len._0_4_ = in_stack_fffffffffffffdd8;
      message_01._M_str = (char *)in_stack_fffffffffffffde0;
      InvalidIdentifier::InvalidIdentifier
                ((InvalidIdentifier *)in_stack_fffffffffffffdd0,message_01);
      __cxa_throw(uVar3,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
    }
    local_74 = (local_40->second).messageAction;
    local_70 = getFederateAt((CommonCore *)in_stack_fffffffffffffdf8._M_current,
                             (LocalFederateId)(BaseType)((ulong)in_stack_fffffffffffffe00 >> 0x20));
    bVar1 = checkActionFlag<helics::BasicHandleInfo,helics::EndpointFlags>(local_40,targeted_flag);
    if (bVar1) {
      pcVar4 = local_90;
      FederateState::getMessageDestinations
                (in_stack_fffffffffffffe00,(InterfaceHandle)(BaseType)((ulong)in_RDI >> 0x20));
      std::
      vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::begin((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               *)in_stack_fffffffffffffdb8);
      std::
      vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::end((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             *)in_stack_fffffffffffffdb8);
      __pred.destination._M_str = pcVar4;
      __pred.destination._M_len = (size_t)in_stack_fffffffffffffde0;
      in_stack_fffffffffffffdf0 =
           std::
           find_if<__gnu_cxx::__normal_iterator<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>*,std::vector<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>>>>,helics::CommonCore::sendTo(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)::__0>
                     (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,__pred);
      std::
      vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::end((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             *)in_stack_fffffffffffffdb8);
      bVar1 = __gnu_cxx::
              operator==<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                        ((__normal_iterator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                          *)in_stack_fffffffffffffdc0,
                         (__normal_iterator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                          *)in_stack_fffffffffffffdb8);
      if (bVar1) {
        pcVar4 = (char *)__cxa_allocate_exception(0x28);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdd0,
                   in_stack_fffffffffffffdc8);
        message_02._M_len._4_4_ = in_stack_fffffffffffffddc;
        message_02._M_len._0_4_ = in_stack_fffffffffffffdd8;
        message_02._M_str = pcVar4;
        InvalidParameter::InvalidParameter((InvalidParameter *)in_stack_fffffffffffffdd0,message_02)
        ;
        __cxa_throw(pcVar4,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
      }
      std::
      vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::~vector((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 *)in_stack_fffffffffffffdd0);
    }
    ActionMessage::ActionMessage(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
    std::__atomic_base<int>::operator++(&(in_RDI->messageCounter).super___atomic_base<int>);
    GVar2 = BasicHandleInfo::getFederateId((BasicHandleInfo *)local_40);
    SmallBuffer::assign(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                        (size_t)in_stack_fffffffffffffdc0);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffdc0);
    _Var5 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffdc0);
    local_1e8 = (ActionMessage *)_Var5._M_len;
    pBStack_1e0 = (BrokerBase *)_Var5._M_str;
    string1._M_len._4_4_ = GVar2.gid;
    string1._M_len._0_4_ = in_stack_fffffffffffffdd8;
    string1._M_str = (char *)in_stack_fffffffffffffde0;
    string2._M_str = (char *)in_stack_fffffffffffffdd0;
    string2._M_len = (size_t)in_stack_fffffffffffffdc8;
    string3._M_str = (char *)in_stack_fffffffffffffdf8._M_current;
    string3._M_len = (size_t)in_stack_fffffffffffffdf0._M_current;
    ActionMessage::setStringData((ActionMessage *)pBStack_1e0,string1,string2,string3);
    FederateState::nextAllowedSendTime(local_70);
    BrokerBase::addActionMessage(pBStack_1e0,local_1e8);
    ActionMessage::~ActionMessage((ActionMessage *)pBStack_1e0);
  }
  return;
}

Assistant:

void CommonCore::sendTo(InterfaceHandle sourceHandle,
                        const void* data,
                        uint64_t length,
                        std::string_view destination)
{
    if (destination.empty()) {
        // sendTo should be the equivalent of send if there is an empty destination
        send(sourceHandle, data, length);
        return;
    }
    const auto* hndl = getHandleInfo(sourceHandle);
    if (hndl == nullptr) {
        throw(InvalidIdentifier("handle is not valid"));
    }

    if (hndl->handleType != InterfaceType::ENDPOINT) {
        throw(InvalidIdentifier("handle does not point to an endpoint"));
    }
    auto* fed = getFederateAt(hndl->local_fed_id);
    if (checkActionFlag(*hndl, targeted_flag)) {
        auto targets = fed->getMessageDestinations(sourceHandle);
        auto res = std::find_if(targets.begin(), targets.end(), [destination](const auto& val) {
            return (val.second == destination);
        });
        if (res == targets.end()) {
            throw(InvalidParameter("targeted endpoint destination not in target list"));
        }
    }
    ActionMessage message(CMD_SEND_MESSAGE);

    message.messageID = ++messageCounter;
    message.source_handle = sourceHandle;
    message.source_id = hndl->getFederateId();
    message.flags = hndl->flags;
    message.payload.assign(data, length);
    message.setStringData(destination, hndl->key, hndl->key);
    message.actionTime = fed->nextAllowedSendTime();
    addActionMessage(std::move(message));
}